

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O2

void __thiscall re2c::Cases::add(Cases *this,uint32_t lb,uint32_t ub,State *to)

{
  Case *this_00;
  uint uVar1;
  Case *pCVar2;
  long lVar3;
  Case *pCVar4;
  pair<unsigned_int,_unsigned_int> local_18;
  
  lVar3 = (ulong)this->cases_size + 1;
  pCVar4 = this->cases + -1;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      local_18.second = ub;
      local_18.first = lb;
      std::
      vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::emplace_back<std::pair<unsigned_int,unsigned_int>>
                ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                  *)(this->cases + this->cases_size),&local_18);
      uVar1 = this->cases_size;
      this->cases[uVar1].to = to;
      this->cases_size = uVar1 + 1;
      return;
    }
    this_00 = pCVar4 + 1;
    pCVar2 = pCVar4 + 1;
    pCVar4 = this_00;
  } while (pCVar2->to != to);
  local_18.second = ub;
  local_18.first = lb;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)this_00,&local_18);
  return;
}

Assistant:

void Cases::add (uint32_t lb, uint32_t ub, State * to)
{
	for (uint32_t i = 0; i < cases_size; ++i)
	{
		if (cases[i].to == to)
		{
			cases[i].ranges.push_back (std::make_pair (lb, ub));
			return;
		}
	}
	cases[cases_size].ranges.push_back (std::make_pair (lb, ub));
	cases[cases_size].to = to;
	++cases_size;
}